

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O3

int __thiscall
FastPForLib::VarIntG8IU::encodeBlock
          (VarIntG8IU *this,uint32_t **src,size_t *srclength,uchar **dest,size_t *dstlength)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int aiStack_68 [8];
  int ithSize [8];
  uint32_t buffer [8];
  
  if (*srclength == 0) {
    **dest = 0xff;
LAB_0012d761:
    iVar13 = 1;
  }
  else {
    sVar8 = *srclength - 4;
    uVar11 = 1;
    bVar9 = 0xff;
    uVar4 = 0;
    uVar6 = 0;
    puVar3 = *src;
    do {
      uVar1 = *puVar3;
      uVar14 = (uint)LZCOUNT(uVar1 | 0xff) >> 3;
      iVar13 = 4 - uVar14;
      uVar6 = uVar6 + iVar13;
      if (8 < uVar6) {
        **dest = bVar9;
        if (uVar4 == 0) goto LAB_0012d761;
        goto LAB_0012d70f;
      }
      aiStack_68[uVar4] = iVar13;
      ithSize[uVar4] = uVar1;
      *src = puVar3 + 1;
      *srclength = sVar8;
      uVar4 = uVar4 + 1;
      sVar8 = sVar8 - 4;
      iVar13 = (uVar11 & 0xff) << ((byte)uVar14 ^ 3);
      bVar9 = bVar9 ^ (byte)iVar13;
      uVar11 = iVar13 * 2;
      puVar3 = puVar3 + 1;
    } while (sVar8 != 0xfffffffffffffffc);
    **dest = bVar9;
LAB_0012d70f:
    iVar13 = 1;
    uVar7 = 0;
    do {
      iVar2 = aiStack_68[uVar7];
      if (0 < iVar2) {
        uVar11 = ithSize[uVar7];
        lVar10 = (long)iVar13;
        uVar6 = 0;
        iVar12 = 0;
        do {
          uVar1 = uVar6 & 0x1f;
          iVar12 = iVar12 + -1;
          uVar6 = uVar6 + 8;
          (*dest)[lVar10] = (uchar)(uVar11 >> uVar1);
          lVar10 = lVar10 + 1;
        } while (-iVar2 != iVar12);
        iVar13 = iVar13 - iVar12;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar4 & 0xffffffff));
    if (8 < iVar13) goto LAB_0012d781;
  }
  lVar10 = (long)iVar13;
  do {
    lVar5 = lVar10 + 1;
    (*dest)[lVar10] = '\0';
    lVar10 = lVar5;
  } while ((int)lVar5 != 9);
LAB_0012d781:
  *dest = *dest + 9;
  *dstlength = *dstlength - 9;
  return 9;
}

Assistant:

int encodeBlock(const uint32_t *&src, size_t &srclength, unsigned char *&dest,
                  size_t &dstlength) {
    unsigned char desc = 0xFF;
    unsigned char bitmask = 0x01;
    uint32_t buffer[8];
    int ithSize[8];
    int length = 0;
    int numInt = 0;

    while (srclength > 0) {
      const uint32_t *temp = src;
      int byteNeeded = getNumByteNeeded(*temp);

      if (PREDICT_FALSE(length + byteNeeded > 8)) {
        break;
      }

      // flip the correct bit in desc
      bitmask = static_cast<unsigned char>(bitmask << (byteNeeded - 1));
      desc = desc ^ bitmask;
      bitmask = static_cast<unsigned char>(bitmask << 1);

      ithSize[numInt] = byteNeeded;
      length += byteNeeded;
      buffer[numInt] = *temp;
      src = src + 1;
      srclength -= 4;
      numInt++;
    }

    dest[0] = desc;
    int written = 1;
    for (int i = 0; i < numInt; i++) {
      int size = ithSize[i];
      uint32_t value = buffer[i];
      for (int j = 0; j < size; j++) {
        dest[written] = static_cast<unsigned char>(value >> (j * 8));
        written++;
      }
    }
    while (written < 9) {
      dest[written++] = 0; // clear padding bytes
    }
    dest += 9;
    dstlength -= 9;
    return 9;
  }